

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionParser.h
# Opt level: O0

void __thiscall ConditionParser::~ConditionParser(ConditionParser *this)

{
  ConditionParser *this_local;
  
  ~ConditionParser(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~ConditionParser() override = default;